

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classweight.cc
# Opt level: O2

void __thiscall CLASSWEIGHTS::classweights::load_string(classweights *this,string *source)

{
  int iVar1;
  istream *piVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  vw_exception *this_00;
  float fVar5;
  string weight;
  string klass;
  string item;
  string local_4e8;
  stringstream __msg;
  ostream local_4b8;
  stringstream ss;
  stringstream inner_ss;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)source,_S_out|_S_in);
  item._M_dataplus._M_p = (pointer)&item.field_2;
  item._M_string_length = 0;
  item.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&ss,(string *)&item,',');
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) {
      std::__cxx11::string::~string((string *)&item);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      return;
    }
    std::__cxx11::stringstream::stringstream((stringstream *)&inner_ss,(string *)&item,_S_out|_S_in)
    ;
    klass._M_dataplus._M_p = (pointer)&klass.field_2;
    klass._M_string_length = 0;
    klass.field_2._M_local_buf[0] = '\0';
    weight._M_dataplus._M_p = (pointer)&weight.field_2;
    weight._M_string_length = 0;
    weight.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&inner_ss,(string *)&klass,':');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&inner_ss,(string *)&weight,':');
    if ((klass._M_string_length == 0) || (weight._M_string_length == 0)) break;
    iVar1 = std::__cxx11::stoi(&klass,(size_t *)0x0,10);
    fVar5 = std::__cxx11::stof(&weight,(size_t *)0x0);
    ___msg = iVar1;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::allocator<std::pair<const_unsigned_int,_float>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this,(key_type *)&__msg);
    *pmVar3 = fVar5;
    std::__cxx11::string::~string((string *)&weight);
    std::__cxx11::string::~string((string *)&klass);
    std::__cxx11::stringstream::~stringstream((stringstream *)&inner_ss);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&__msg);
  poVar4 = std::operator<<(&local_4b8,"error: while parsing --classweight ");
  std::operator<<(poVar4,(string *)&item);
  this_00 = (vw_exception *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  VW::vw_exception::vw_exception
            (this_00,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/classweight.cc"
             ,0x1b,&local_4e8);
  __cxa_throw(this_00,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

void load_string(std::string const& source)
  {
    std::stringstream ss(source);
    std::string item;
    while (std::getline(ss, item, ','))
    {
      std::stringstream inner_ss(item);
      std::string klass;
      std::string weight;
      std::getline(inner_ss, klass, ':');
      std::getline(inner_ss, weight, ':');

      if (!klass.size() || !weight.size())
      {
        THROW("error: while parsing --classweight " << item);
      }

      int klass_int = std::stoi(klass);
      float weight_double = std::stof(weight);

      weights[klass_int] = weight_double;
    }
  }